

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O1

void __thiscall
FIX::ThreadedSocketConnection::~ThreadedSocketConnection(ThreadedSocketConnection *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Responder)._vptr_Responder = (_func_int **)&PTR__ThreadedSocketConnection_001fa750;
  if (this->m_pSession != (Session *)0x0) {
    Session::setResponder(this->m_pSession,(Responder *)0x0);
    Session::unregisterSession(&this->m_pSession->m_sessionID);
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&(this->m_sessions)._M_t);
  pcVar1 = (this->m_parser).m_buffer._M_dataplus._M_p;
  paVar2 = &(this->m_parser).m_buffer.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_sourceAddress)._M_dataplus._M_p;
  paVar2 = &(this->m_sourceAddress).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_address)._M_dataplus._M_p;
  paVar2 = &(this->m_address).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ThreadedSocketConnection::~ThreadedSocketConnection() {
  if (m_pSession) {
    m_pSession->setResponder(0);
    Session::unregisterSession(m_pSession->getSessionID());
  }
}